

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

uint64_t __thiscall bssl::DTLSTimer::MicrosecondsRemaining(DTLSTimer *this,OPENSSL_timeval now)

{
  bool bVar1;
  uint local_34;
  ulong uStack_30;
  uint32_t usec;
  uint64_t sec;
  DTLSTimer *this_local;
  OPENSSL_timeval now_local;
  
  uStack_30 = now.tv_sec;
  local_34 = now.tv_usec;
  bVar1 = IsSet(this);
  if (bVar1) {
    if (((this->expire_time_).tv_sec < uStack_30) ||
       ((uStack_30 == (this->expire_time_).tv_sec && ((this->expire_time_).tv_usec <= local_34)))) {
      now_local.tv_usec = 0;
      now_local._12_4_ = 0;
    }
    else {
      uStack_30 = (this->expire_time_).tv_sec - uStack_30;
      if ((this->expire_time_).tv_usec < local_34) {
        uStack_30 = uStack_30 - 1;
        local_34 = ((this->expire_time_).tv_usec + 1000000) - local_34;
      }
      else {
        local_34 = (this->expire_time_).tv_usec - local_34;
      }
      if ((uStack_30 == 0) && (local_34 < 15000)) {
        now_local.tv_usec = 0;
        now_local._12_4_ = 0;
      }
      else if (uStack_30 < 0x10c6f7a0b5ee) {
        if (-(ulong)local_34 - 1 < uStack_30 * 1000000) {
          now_local.tv_usec = 0xffffffff;
          now_local._12_4_ = 0xffffffff;
        }
        else {
          now_local._8_8_ = uStack_30 * 1000000 + (ulong)local_34;
        }
      }
      else {
        now_local.tv_usec = 0xffffffff;
        now_local._12_4_ = 0xffffffff;
      }
    }
  }
  else {
    now_local.tv_usec = 0xffffffff;
    now_local._12_4_ = 0xffffffff;
  }
  return now_local._8_8_;
}

Assistant:

uint64_t DTLSTimer::MicrosecondsRemaining(OPENSSL_timeval now) const {
  if (!IsSet()) {
    return kNever;
  }

  if (now.tv_sec > expire_time_.tv_sec ||
      (now.tv_sec == expire_time_.tv_sec &&
       now.tv_usec >= expire_time_.tv_usec)) {
    return 0;
  }

  uint64_t sec = expire_time_.tv_sec - now.tv_sec;
  uint32_t usec;
  if (expire_time_.tv_usec >= now.tv_usec) {
    usec = expire_time_.tv_usec - now.tv_usec;
  } else {
    sec--;
    usec = expire_time_.tv_usec + 1000000 - now.tv_usec;
  }

  // If remaining time is less than 15 ms, return 0 to prevent issues because of
  // small divergences with socket timeouts.
  if (sec == 0 && usec < 15000) {
    return 0;
  }

  if (sec > UINT64_MAX / 1000000) {
    return kNever;
  }
  sec *= 1000000;
  if (sec > UINT64_MAX - usec) {
    return kNever;
  }
  return sec + usec;
}